

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall
nonius::standard_reporter::print_statistic_estimate
          (standard_reporter *this,char *name,
          estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> estimate)

{
  function<std::basic_ostream<char,_std::char_traits<char>_>_&()> *pfVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  size_t sVar3;
  ostream *poVar4;
  detail *this_00;
  char *pcVar5;
  string local_70;
  string local_50;
  
  if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &(this->super_reporter).os;
    pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
    *(undefined8 *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 8) = 7;
    if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
      pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
      *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) =
           *(uint *)(pbVar2 + *(long *)(*(long *)pbVar2 + -0x18) + 0x18) & 0xfffffefb;
      if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
        pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
        if (name == (char *)0x0) {
          std::ios::clear((int)pbVar2 + (int)*(undefined8 *)(*(long *)pbVar2 + -0x18));
        }
        else {
          sVar3 = strlen(name);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar2,name,sVar3);
        }
        this_00 = (detail *)0x1f5661;
        std::__ostream_insert<char,std::char_traits<char>>(pbVar2,": ",2);
        detail::pretty_duration_abi_cxx11_(&local_70,this_00,(fp_seconds)estimate.point.__r);
        std::__ostream_insert<char,std::char_traits<char>>
                  (pbVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (this->summary == false) {
          if ((this->super_reporter).os.super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_00140509;
          pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
          pcVar5 = ", lb ";
          std::__ostream_insert<char,std::char_traits<char>>(pbVar2,", lb ",5);
          detail::pretty_duration_abi_cxx11_
                    (&local_70,(detail *)pcVar5,(fp_seconds)estimate.lower_bound.__r);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (pbVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
          pcVar5 = ", ub ";
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ub ",5);
          detail::pretty_duration_abi_cxx11_
                    (&local_50,(detail *)pcVar5,(fp_seconds)estimate.upper_bound.__r);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ci ",5);
          *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 3;
          std::ostream::_M_insert<double>(estimate.confidence_interval);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
          pbVar2 = (*(this->super_reporter).os._M_invoker)((_Any_data *)pfVar1);
          std::__ostream_insert<char,std::char_traits<char>>(pbVar2,"\n",1);
          return;
        }
      }
    }
  }
LAB_00140509:
  std::__throw_bad_function_call();
}

Assistant:

NONIUS_NOEXCEPT override {
        return "operation not supported for this parameter type";
    }